

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPMCanvas.h
# Opt level: O2

void adapt::gpm2::detail::MakeDataObjectCommon<adapt::gpm2::detail::OutputFunc1>
               (OutputFunc1 output_func,
               vector<adapt::cuf::Variant<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<adapt::cuf::Variant<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
               *its,size_t size)

{
  Variant<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
  *pVVar1;
  Variant<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *it;
  Variant<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
  *this;
  size_t i;
  size_t sVar2;
  vector<adapt::cuf::Variant<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<adapt::cuf::Variant<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  *__range4;
  OverloadedLambda<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_thayakawa_gh[P]ADAPT_GPM2_examples____ADAPT_GPM2_GPMCanvas_h:393:20),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_thayakawa_gh[P]ADAPT_GPM2_examples____ADAPT_GPM2_GPMCanvas_h:394:3)>
  f;
  End<> local_42;
  OverloadedLambda<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_thayakawa_gh[P]ADAPT_GPM2_examples____ADAPT_GPM2_GPMCanvas_h:393:20),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_thayakawa_gh[P]ADAPT_GPM2_examples____ADAPT_GPM2_GPMCanvas_h:394:3)>
  local_41;
  size_t local_40;
  OutputFunc1 local_38;
  
  local_40 = size;
  local_38.g = output_func.g;
  for (sVar2 = 0; sVar2 != local_40; sVar2 = sVar2 + 1) {
    pVVar1 = (Variant<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              *)(its->
                super__Vector_base<adapt::cuf::Variant<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<adapt::cuf::Variant<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    for (this = (Variant<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                 *)(its->
                   super__Vector_base<adapt::cuf::Variant<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<adapt::cuf::Variant<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; this != pVVar1; this = this + 0x10) {
      adapt::cuf::
      Variant<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
      ::
      Visit<adapt::cuf::detail::OverloadedLambda<adapt::gpm2::detail::MakeDataObjectCommon<adapt::gpm2::detail::OutputFunc1>(adapt::gpm2::detail::OutputFunc1,std::vector<adapt::cuf::Variant<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::allocator<adapt::cuf::Variant<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>&,unsigned_long)::_lambda(__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>&,auto:1)_1_,adapt::gpm2::detail::MakeDataObjectCommon<adapt::gpm2::detail::OutputFunc1>(adapt::gpm2::detail::OutputFunc1,std::vector<adapt::cuf::Variant<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::allocator<adapt::cuf::Variant<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>&,unsigned_long)::_lambda(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&,auto:1)_1_>&,adapt::gpm2::detail::OutputFunc1&>
                (this,&local_41,&local_38);
    }
    GPMCanvas::Command<char_const(&)[2],adapt::cuf::detail::print::End<>>
              (local_38.g,(char (*) [2])0x11b120,&local_42);
  }
  return;
}

Assistant:

inline void MakeDataObjectCommon(OutputFunc output_func, std::vector<DataIterator>& its, size_t size)
{
	auto f = Overload([](std::vector<double>::const_iterator& it, auto output_func) { output_func(" ", *it, print::end<'\0'>()); ++it; },
		[](std::vector<std::string>::const_iterator& it, auto output_func) { output_func(" ", it->c_str(), print::end<'\0'>()); ++it; });

	for (size_t i = 0; i < size; ++i)
	{
		for (auto& it : its)
		{
			it.Visit(f, output_func);
		}
		output_func("\n", print::end<>());
	}
}